

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O2

void __thiscall
llm_tokenizer_bpe_session::add_new_bigram(llm_tokenizer_bpe_session *this,int left,int right)

{
  pointer plVar1;
  char *pcVar2;
  int iVar3;
  string right_token;
  string left_token;
  llm_bigram_bpe bigram;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  int local_38;
  size_t local_30;
  
  if (right != -1 && left != -1) {
    plVar1 = (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar2 = plVar1[left].text;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,pcVar2,pcVar2 + plVar1[left].n);
    plVar1 = (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar2 = plVar1[right].text;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,pcVar2,pcVar2 + plVar1[right].n);
    iVar3 = llama_vocab::find_bpe_rank(this->vocab,&local_a0,&local_c0);
    if (-1 < iVar3) {
      local_58._M_p = (pointer)&local_48;
      local_50 = 0;
      local_48._M_local_buf[0] = '\0';
      local_60._0_4_ = left;
      local_60._4_4_ = right;
      std::operator+(&local_80,&local_a0,&local_c0);
      std::__cxx11::string::operator=((string *)&local_58,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      local_30 = local_c0._M_string_length + local_a0._M_string_length;
      local_38 = iVar3;
      llama_vocab::std::
      priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
      ::push(&(this->work_queue).
              super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
             ,(value_type *)local_60);
      std::__cxx11::string::~string((string *)&local_58);
    }
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return;
}

Assistant:

void add_new_bigram(int left, int right) {
        if (left == -1 || right == -1) {
            return;
        }
        std::string left_token  = std::string(symbols[left].text,  symbols[left].n);
        std::string right_token = std::string(symbols[right].text, symbols[right].n);

        int rank_found = -1;

        rank_found = vocab.find_bpe_rank(left_token, right_token);

        if (rank_found < 0) {
            return;
        }

        llm_bigram_bpe bigram;

        bigram.left  = left;
        bigram.right = right;
        bigram.text  = left_token + right_token;
        bigram.size  = left_token.size() + right_token.size();
        bigram.rank  = rank_found;

        work_queue.push(bigram);
    }